

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

uint64_t Hex::Hexdumper_base::getthreshold(ostream *os)

{
  long lVar1;
  int __ix;
  uint64_t *puVar2;
  
  lVar1 = *(long *)(*(long *)os + -0x18);
  __ix = __threshold();
  puVar2 = (uint64_t *)std::ios_base::iword((ios_base *)(os + lVar1),__ix);
  return *puVar2;
}

Assistant:

static uint64_t getthreshold(std::ostream& os) { return os.iword(__threshold()); }